

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Farmland.hpp
# Opt level: O0

void __thiscall Farmland::~Farmland(Farmland *this)

{
  Farmland *this_local;
  
  ~Farmland(this);
  operator_delete(this,0xe8);
  return;
}

Assistant:

virtual ~Farmland() {}